

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslFragColorDecl_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,int imageCount)

{
  ostream *poVar1;
  allocator<char> local_19d [13];
  ostringstream local_190 [8];
  ostringstream samplerArray;
  int imageCount_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"fragColors[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
  std::operator<<(poVar1,"]");
  if ((int)this < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"fragColor",local_19d);
    std::allocator<char>::~allocator(local_19d);
  }
  else {
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageTest::getGlslFragColorDecl (int imageCount)
{
	std::ostringstream samplerArray;
	samplerArray << "fragColors[" << imageCount << "]";

	return imageCount > 1 ? samplerArray.str() : "fragColor";
}